

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.hpp
# Opt level: O2

void __thiscall
gl4cts::EnhancedLayouts::VaryingStructureLocationsTest::~VaryingStructureLocationsTest
          (VaryingStructureLocationsTest *this)

{
  (this->super_TextureTestBase).super_TestBase.super_TestCase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__VaryingStructureLocationsTest_01db6450;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->m_array_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
            );
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->m_single_data).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  tcu::TestCase::~TestCase((TestCase *)this);
  return;
}

Assistant:

~VaryingStructureLocationsTest()
	{
	}